

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::anon_unknown_35::check_type
          (anon_unknown_35 *this,gc_heap_ptr<mjs::global_object> *global,value *v)

{
  bool bVar1;
  value_type vVar2;
  object_ptr *this_00;
  native_error_exception *this_01;
  global_object *this_02;
  undefined8 extraout_RDX;
  gc_heap_ptr<mjs::regexp_object> gVar3;
  wstring local_220 [32];
  wstring_view local_200;
  wstring local_1f0;
  wstring_view local_1d0 [2];
  undefined1 local_1b0 [24];
  wostringstream woss;
  value *v_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  gc_heap_ptr<mjs::regexp_object> *r;
  
  cast_to_regexp(this,v);
  bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool((gc_heap_ptr_untyped *)this);
  if (!bVar1) {
    gc_heap_ptr<mjs::regexp_object>::~gc_heap_ptr((gc_heap_ptr<mjs::regexp_object> *)this);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)(local_1b0 + 0x10));
    vVar2 = value::type(v);
    if (vVar2 == object) {
      this_00 = value::object_value(v);
      gc_heap_ptr<mjs::object>::operator->(this_00);
      object::class_name((object *)local_1b0);
      mjs::operator<<((wostream *)(local_1b0 + 0x10),(string *)local_1b0);
      string::~string((string *)local_1b0);
    }
    else {
      debug_print((wostream *)(local_1b0 + 0x10),v,4,0x7fffffff,0);
    }
    std::operator<<((wostream *)(local_1b0 + 0x10)," is not a RegExp");
    this_01 = (native_error_exception *)__cxa_allocate_exception(0x58);
    this_02 = gc_heap_ptr<mjs::global_object>::operator->(global);
    global_object::stack_trace_abi_cxx11_(&local_1f0,this_02);
    local_1d0[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_1f0);
    std::__cxx11::wostringstream::str();
    local_200 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_220);
    native_error_exception::native_error_exception(this_01,type,local_1d0,&local_200);
    __cxa_throw(this_01,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  gVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  gVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::regexp_object>)gVar3.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<regexp_object> check_type(const gc_heap_ptr<global_object>& global, const value& v) {
    if (auto r = cast_to_regexp(v)) {
        return r;
    }
    std::wostringstream woss;
    if (v.type() == value_type::object) {
        woss << v.object_value()->class_name();
    } else {
        debug_print(woss, v, 4);
    }
    woss << " is not a RegExp";
    throw native_error_exception{native_error_type::type, global->stack_trace(), woss.str()};
}